

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithms.cpp
# Opt level: O2

pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger> * __thiscall
Algorithms::discreteSquareRoot
          (pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>
           *__return_storage_ptr__,Algorithms *this,BigInteger *p,BigInteger *n)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  BigInteger *pBVar4;
  pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger> *this_00;
  BigInteger x1;
  BigInteger x2;
  pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger> w;
  BigInteger local_270;
  pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger> res;
  BigInteger a;
  BigInteger local_1f0;
  BigInteger local_1d0;
  BigInteger local_1b0;
  BigInteger local_190;
  BigInteger local_170;
  BigInteger local_150;
  BigInteger local_130;
  BigInteger local_110;
  BigInteger local_f0;
  BigInteger local_d0;
  pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger> local_b0;
  BigInteger local_70;
  BigInteger local_50;
  
  BigIntegerLibrary::BigInteger::BigInteger(&local_f0,n);
  pBVar4 = &local_110;
  BigIntegerLibrary::BigInteger::BigInteger(pBVar4,p);
  iVar2 = legendreSymbol((Algorithms *)pBVar4,&local_f0,&local_110);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_110);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_f0);
  if (iVar2 == -1) {
    BigIntegerLibrary::BigInteger::BigInteger(&w.first,-1);
    BigIntegerLibrary::BigInteger::BigInteger(&res.first,-1);
    std::pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>::
    pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger,_true>
              (__return_storage_ptr__,&w.first,&res.first);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&res);
    this_00 = &w;
    goto LAB_00107a64;
  }
  BigIntegerLibrary::BigInteger::BigInteger(&a);
  iVar2 = 0x65;
  do {
    iVar2 = iVar2 + -1;
    if (iVar2 == 0) break;
    BigIntegerLibrary::BigInteger::BigInteger(&local_130,1);
    BigIntegerLibrary::BigInteger::operator-(&local_d0,p,1);
    random((Algorithms *)&w);
    BigIntegerLibrary::BigInteger::operator=(&a,&w.first);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&w);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_d0);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_130);
    BigIntegerLibrary::BigInteger::operator*(&w.first,&a,&a);
    BigIntegerLibrary::BigInteger::operator-(&local_50,&w.first,n);
    pBVar4 = &local_70;
    BigIntegerLibrary::BigInteger::BigInteger(&local_70,p);
    iVar3 = legendreSymbol((Algorithms *)pBVar4,&local_50,&local_70);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_70);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_50);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&w);
  } while (iVar3 != -1);
  BigIntegerLibrary::BigInteger::operator*(&w.first,&a,&a);
  BigIntegerLibrary::BigInteger::operator-(&local_150,&w.first,n);
  pBVar4 = &local_170;
  BigIntegerLibrary::BigInteger::BigInteger(pBVar4,p);
  iVar2 = legendreSymbol((Algorithms *)pBVar4,&local_150,&local_170);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_170);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_150);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&w);
  if (iVar2 == -1) {
    res.first.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = 1;
    std::pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>::
    pair<BigIntegerLibrary::BigInteger_&,_int,_true>(&w,&a,(int *)&res);
    std::pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>::pair(&local_b0,&w);
    BigIntegerLibrary::BigInteger::operator+(&x1,p,1);
    BigIntegerLibrary::BigInteger::operator/(&local_190,&x1,2);
    BigIntegerLibrary::BigInteger::BigInteger(&local_1b0,p);
    BigIntegerLibrary::BigInteger::operator*(&x2,&a,&a);
    BigIntegerLibrary::BigInteger::operator-(&local_1d0,&x2,n);
    powComplexMod(&res,this,&local_b0,&local_190,&local_1b0,&local_1d0);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_1d0);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&x2);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_1b0);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&local_190);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&x1);
    std::pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>::~pair(&local_b0);
    BigIntegerLibrary::BigInteger::BigInteger(&x1,0);
    bVar1 = BigIntegerLibrary::BigInteger::operator==(&res.second,&x1);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&x1);
    if (bVar1) {
      BigIntegerLibrary::BigInteger::BigInteger(&x1,&res.first);
      while( true ) {
        BigIntegerLibrary::BigInteger::BigInteger(&x2,0);
        bVar1 = BigIntegerLibrary::BigInteger::operator<(&x1,&x2);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&x2);
        if (!bVar1) break;
        BigIntegerLibrary::BigInteger::operator+=(&x1,p);
      }
      BigIntegerLibrary::BigInteger::operator-(&local_270,p,&x1);
      BigIntegerLibrary::BigInteger::operator%(&x2,&local_270,p);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_270);
      BigIntegerLibrary::BigInteger::operator*(&local_1f0,&x1,&x1);
      BigIntegerLibrary::BigInteger::operator%(&local_270,&local_1f0,p);
      bVar1 = BigIntegerLibrary::BigInteger::operator==(&local_270,n);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_270);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_1f0);
      if (!bVar1) {
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&x2);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&x1);
        goto LAB_00107a05;
      }
      std::pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>::
      pair<BigIntegerLibrary::BigInteger_&,_BigIntegerLibrary::BigInteger_&,_true>
                (__return_storage_ptr__,&x1,&x2);
    }
    else {
LAB_00107a05:
      BigIntegerLibrary::BigInteger::BigInteger(&x1,-1);
      BigIntegerLibrary::BigInteger::BigInteger(&x2,-1);
      std::pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>::
      pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger,_true>
                (__return_storage_ptr__,&x1,&x2);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&x2);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&x1);
    std::pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>::~pair(&res);
    std::pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>::~pair(&w);
  }
  else {
    BigIntegerLibrary::BigInteger::BigInteger(&w.first,-1);
    BigIntegerLibrary::BigInteger::BigInteger(&res.first,-1);
    std::pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger>::
    pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger,_true>
              (__return_storage_ptr__,&w.first,&res.first);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&res);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&w);
  }
  this_00 = (pair<BigIntegerLibrary::BigInteger,_BigIntegerLibrary::BigInteger> *)&a;
LAB_00107a64:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)this_00);
  return __return_storage_ptr__;
}

Assistant:

pair<BigInteger, BigInteger> Algorithms::discreteSquareRoot(BigInteger p, BigInteger n) {
    if(legendreSymbol(n, p) == -1) {
        return {BigInteger(-1), BigInteger(-1)};
    }
    BigInteger a;
    for(int i = 0; i < 100; ++i) {
        a = random(1, p - 1);
        if(legendreSymbol(a * a - n, p) == -1) {
            break;
        }
    }
    if(legendreSymbol(a * a - n, p) != -1) {
        return {BigInteger(-1), BigInteger(-1)};
    }

    pair<BigInteger, BigInteger> w{a, 1};
    auto res = powComplexMod(w, (p + 1) / 2, p, a * a - n);
    if(res.second == BigInteger(0)) {
        BigInteger x1 = res.first;
        while (x1 < 0) {
            x1 += p;
        }
        BigInteger x2 = (p - x1) % p;
        if (x1 * x1 % p == n) {
            return {x1, x2};
        }
    }
    return {BigInteger(-1), BigInteger(-1)};

}